

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

bool __thiscall r_exec::Group::invalidate(Group *this)

{
  pthread_mutex_t *__mutex;
  _Hash_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  Group *in_RAX;
  _Hash_node_base *p_Var4;
  Group *local_38;
  
  local_38 = in_RAX;
  bVar2 = Object<r_code::LObject,_r_exec::LObject>::invalidate
                    ((Object<r_code::LObject,_r_exec::LObject> *)this);
  p_Var4 = (this->group_views)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0 && !bVar2) {
    do {
      p_Var1 = p_Var4[2]._M_nxt[4]._M_nxt;
      __mutex = (pthread_mutex_t *)(p_Var1 + 0x47);
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      local_38 = this;
      std::
      _Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(p_Var1 + 0x76),&local_38);
      pthread_mutex_unlock(__mutex);
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return bVar2;
}

Assistant:

bool Group::invalidate()
{
    if (LObject::invalidate()) {
        return true;
    }

    // unregister from all groups it views.
    std::unordered_map<uint64_t, P<View> >::const_iterator gv;

    for (gv = group_views.begin(); gv != group_views.end(); ++gv) {
        Group *group = (Group *)gv->second->object;
        std::lock_guard<std::mutex> guard(group->mutex);
        group->viewing_groups.erase(this);
    }

    /* We keep the group intact: the only thing is now the group will not be updated anymore.
    // remove all views that are hosted by this group.
    FOR_ALL_VIEWS_BEGIN(this,v)

    v->second->object->acq_views();
    v->second->object->views.erase(v->second); // delete view from object's views.
    v->second->object->rel_views();

    FOR_ALL_VIEWS_END

    notification_views.clear();
    ipgm_views.clear();
    anti_ipgm_views.clear();
    input_less_ipgm_views.clear();
    other_views.clear();
    group_views.clear();
    */
    return false;
}